

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

void Timidity::PrintRIFF(RIFF_Chunk *chunk,int level)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  
  if (level != 0x7f) {
    iVar2 = level * 2;
    if (0 < level) {
      PrintRIFF::prefix[iVar2 - 2] = ' ';
      PrintRIFF::prefix[iVar2 - 1] = ' ';
    }
    PrintRIFF::prefix[iVar2] = '\0';
    uVar1 = chunk->magic;
    printf("%sChunk: %c%c%c%c (%d bytes)",PrintRIFF::prefix,(ulong)(uVar1 & 0xff),
           (ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18),
           CONCAT44((int)((ulong)in_RAX >> 0x20),chunk->length));
    uVar1 = chunk->subtype;
    if (uVar1 != 0) {
      printf(" subtype: %c%c%c%c",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
             (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18));
    }
    putchar(10);
    if (chunk->child != (RIFF_Chunk *)0x0) {
      printf("%s{\n",PrintRIFF::prefix);
      PrintRIFF(chunk->child,level + 1);
      printf("%s}\n",PrintRIFF::prefix);
    }
    if (chunk->next != (RIFF_Chunk *)0x0) {
      PrintRIFF(chunk->next,level);
    }
    if (0 < level) {
      PrintRIFF::prefix[iVar2 - 2] = '\0';
    }
  }
  return;
}

Assistant:

void PrintRIFF(RIFF_Chunk *chunk, int level)
{
	static char prefix[128];

	if ( level == sizeof(prefix)-1 ) {
		return;
	}
	if ( level > 0 ) {
		prefix[(level-1)*2] = ' ';
		prefix[(level-1)*2+1] = ' ';
	}
	prefix[level*2] = '\0';
	printf("%sChunk: %c%c%c%c (%d bytes)", prefix,
		((chunk->magic >>  0) & 0xFF),
		((chunk->magic >>  8) & 0xFF),
		((chunk->magic >> 16) & 0xFF),
		((chunk->magic >> 24) & 0xFF), chunk->length);
	if ( chunk->subtype ) {
		printf(" subtype: %c%c%c%c",
			((chunk->subtype >>  0) & 0xFF),
			((chunk->subtype >>  8) & 0xFF),
			((chunk->subtype >> 16) & 0xFF),
			((chunk->subtype >> 24) & 0xFF));
	}
	printf("\n");
	if ( chunk->child ) {
		printf("%s{\n", prefix);
		PrintRIFF(chunk->child, level + 1);
		printf("%s}\n", prefix);
	}
	if ( chunk->next ) {
		PrintRIFF(chunk->next, level);
	}
	if ( level > 0 ) {
		prefix[(level-1)*2] = '\0';
	}
}